

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O3

void dump_fx(frameex1 *fx_addr68k)

{
  undefined1 *puVar1;
  LispPTR *pLVar2;
  ushort uVar3;
  LispPTR x;
  uint uVar4;
  DLword *pDVar5;
  char *__format;
  frameex1 *pfVar6;
  DLword *pDVar7;
  
  if ((*(ushort *)&fx_addr68k->field_0x2 & 0xe000) == 0xc000) {
    puVar1 = &fx_addr68k->field_0x2;
    x = get_framename(fx_addr68k);
    printf("\n*** Frame Extension for ");
    print(x);
    if (((ulong)fx_addr68k & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",fx_addr68k);
    }
    printf("\n %x : %x %x ",(ulong)((long)fx_addr68k - (long)Lisp_world) >> 1,
           (ulong)*(ushort *)((ulong)fx_addr68k ^ 2),(ulong)*(ushort *)((ulong)puVar1 ^ 2));
    putchar(0x5b);
    uVar3 = *(ushort *)&fx_addr68k->field_0x2;
    if ((uVar3 >> 0xc & 1) != 0) {
      printf("F,");
      uVar3 = *(ushort *)puVar1;
    }
    if ((uVar3 >> 10 & 1) != 0) {
      printf("incall, ");
      uVar3 = *(ushort *)puVar1;
    }
    uVar4 = (uint)uVar3;
    if ((uVar3 >> 9 & 1) != 0) {
      printf("V, ");
      uVar4 = (uint)(byte)*puVar1;
    }
    printf("usecnt = %d]; alink",(ulong)(uVar4 & 0xff));
    if ((fx_addr68k->alink & 1) != 0) {
      printf("[SLOWP]");
    }
    pLVar2 = &fx_addr68k->fnheader;
    if (((ulong)pLVar2 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",pLVar2);
    }
    printf("\n %x : %x %x fnheadlo, fnheadhi\n",(ulong)((long)pLVar2 - (long)Lisp_world) >> 1,
           (ulong)*(ushort *)((ulong)pLVar2 ^ 2),
           (ulong)*(ushort *)((ulong)((long)&fx_addr68k->fnheader + 2U) ^ 2));
    pDVar7 = &fx_addr68k->pc;
    if (((ulong)pDVar7 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",pDVar7);
    }
    printf("\n %x : %x %x next,     pc\n",(ulong)((long)pDVar7 - (long)Lisp_world) >> 1,
           (ulong)*(ushort *)((ulong)pDVar7 ^ 2),
           (ulong)*(ushort *)((ulong)&fx_addr68k->nextblock ^ 2));
    pLVar2 = &fx_addr68k->nametable;
    if (((ulong)pLVar2 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",pLVar2);
    }
    printf("\n %x : %x %x LoNmTbl,  HiNmTbl\n",(ulong)((long)pLVar2 - (long)Lisp_world) >> 1,
           (ulong)*(ushort *)((ulong)pLVar2 ^ 2),
           (ulong)*(ushort *)((ulong)((long)&fx_addr68k->nametable + 2U) ^ 2));
    pDVar7 = &fx_addr68k->clink;
    if (((ulong)pDVar7 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",pDVar7);
    }
    printf("\n %x : %x %x #blink,   #clink\n",(ulong)((long)pDVar7 - (long)Lisp_world) >> 1,
           (ulong)*(ushort *)((ulong)pDVar7 ^ 2),(ulong)*(ushort *)((ulong)&fx_addr68k->blink ^ 2));
    pDVar5 = MachineState.csp + 2;
    if ((frameex1 *)(MachineState.pvar + -10) != fx_addr68k) {
      pDVar5 = (DLword *)((ulong)((uint)fx_addr68k->nextblock * 2) + (long)Stackspace);
    }
    if (((ulong)pDVar5 & 1) == 0 && pDVar7 <= pDVar5) {
      if (pDVar7 < pDVar5) {
        pfVar6 = fx_addr68k + 1;
        do {
          pDVar7 = pDVar7 + 2;
          if (((ulong)fx_addr68k & 1) != 0) {
            printf("Misaligned pointer in LAddrFromNative %p\n",pDVar7);
          }
          printf("\n %x : %x %x",(ulong)((long)pfVar6 - (long)Lisp_world) >> 1,
                 (ulong)*(ushort *)((ulong)pfVar6 ^ 2),
                 (ulong)*(ushort *)((ulong)&pfVar6->field_0x2 ^ 2));
          pfVar6 = (frameex1 *)&pfVar6->fnheader;
        } while (pDVar7 < pDVar5);
      }
      return;
    }
    __format = "\nNext block invalid";
  }
  else {
    __format = "\nInvalid frame,NOT FX";
  }
  printf(__format);
  return;
}

Assistant:

void dump_fx(struct frameex1 *fx_addr68k) {
  DLword *next68k;
  DLword *ptr;
  LispPTR atomindex;

  ptr = (DLword *)fx_addr68k;

  if (fx_addr68k->flags != 6) {
    printf("\nInvalid frame,NOT FX");
    return;
  }

  atomindex = get_framename((struct frameex1 *)fx_addr68k);
  printf("\n*** Frame Extension for ");
  print(atomindex);
  printf("\n %x : %x %x ", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  putchar('[');
  if (fx_addr68k->fast) printf("F,");
  if (fx_addr68k->incall) printf("incall, ");
  if (fx_addr68k->validnametable) printf("V, ");
  printf("usecnt = %d]; alink", fx_addr68k->usecount);
  if (fx_addr68k->alink & 1) printf("[SLOWP]");

  ptr += 2;
  printf("\n %x : %x %x fnheadlo, fnheadhi\n", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  ptr += 2;
  printf("\n %x : %x %x next,     pc\n", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  ptr += 2;
  printf("\n %x : %x %x LoNmTbl,  HiNmTbl\n", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  ptr += 2;
  printf("\n %x : %x %x #blink,   #clink\n", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  /* should pay attention to the name table like RAID does */

  next68k = NativeAligned2FromStackOffset(fx_addr68k->nextblock);
  if (fx_addr68k == CURRENTFX) { next68k = CurrentStackPTR + 2; }

  if ((next68k < ptr) || (((UNSIGNED)next68k & 1) != 0)) {
    printf("\nNext block invalid");
    return;
  }

  while (next68k > ptr) {
    ptr += 2;
    printf("\n %x : %x %x", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));
  }
}